

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void ARGBExtractAlphaRow_SSE2(uint8_t *src_argb,uint8_t *dst_a,int width)

{
  uint *puVar1;
  bool bVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  uint uVar11;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  uint *puVar16;
  uint *puVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int width_local;
  
  do {
    uVar11 = *(uint *)src_argb;
    puVar12 = (uint *)((long)src_argb + 4);
    puVar13 = (uint *)((long)src_argb + 8);
    puVar14 = (uint *)((long)src_argb + 0xc);
    puVar1 = (uint *)((long)src_argb + 0x10);
    puVar15 = (uint *)((long)src_argb + 0x14);
    puVar16 = (uint *)((long)src_argb + 0x18);
    puVar17 = (uint *)((long)src_argb + 0x1c);
    src_argb = (uint8_t *)((long)src_argb + 0x20);
    auVar19._0_4_ = uVar11 >> 0x18;
    auVar19._4_4_ = *puVar12 >> 0x18;
    auVar19._8_4_ = *puVar13 >> 0x18;
    auVar19._12_4_ = *puVar14 >> 0x18;
    auVar20._0_4_ = *puVar1 >> 0x18;
    auVar20._4_4_ = *puVar15 >> 0x18;
    auVar20._8_4_ = *puVar16 >> 0x18;
    auVar20._12_4_ = *puVar17 >> 0x18;
    auVar19 = packssdw(auVar19,auVar20);
    sVar3 = auVar19._0_2_;
    sVar4 = auVar19._2_2_;
    sVar5 = auVar19._4_2_;
    sVar6 = auVar19._6_2_;
    sVar7 = auVar19._8_2_;
    sVar8 = auVar19._10_2_;
    sVar9 = auVar19._12_2_;
    sVar10 = auVar19._14_2_;
    *(ulong *)dst_a =
         CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar19[0xe] - (0xff < sVar10),
                  CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar19[0xc] - (0xff < sVar9),
                           CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar19[10] - (0xff < sVar8),
                                    CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar19[8] -
                                             (0xff < sVar7),
                                             CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar19[6] -
                                                      (0xff < sVar6),
                                                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                               auVar19[4] - (0xff < sVar5),
                                                               CONCAT11((0 < sVar4) *
                                                                        (sVar4 < 0x100) * auVar19[2]
                                                                        - (0xff < sVar4),
                                                                        (0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar19[0]
                                                                        - (0xff < sVar3))))))));
    dst_a = dst_a + 8;
    iVar18 = width + -8;
    bVar2 = 7 < width;
    width = iVar18;
  } while (iVar18 != 0 && bVar2);
  return;
}

Assistant:

void ARGBExtractAlphaRow_SSE2(const uint8_t* src_argb,
                              uint8_t* dst_a,
                              int width) {
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0), %%xmm0                  \n"
      "movdqu      0x10(%0), %%xmm1              \n"
      "lea         0x20(%0), %0                  \n"
      "psrld       $0x18, %%xmm0                 \n"
      "psrld       $0x18, %%xmm1                 \n"
      "packssdw    %%xmm1, %%xmm0                \n"
      "packuswb    %%xmm0, %%xmm0                \n"
      "movq        %%xmm0,(%1)                   \n"
      "lea         0x8(%1), %1                   \n"
      "sub         $0x8, %2                      \n"
      "jg          1b                            \n"
      : "+r"(src_argb),  // %0
        "+r"(dst_a),     // %1
        "+rm"(width)     // %2
      :
      : "memory", "cc", "xmm0", "xmm1");
}